

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

LY_ERR json_print_member(jsonpr_ctx *pctx,lyd_node *node,ly_bool is_attr)

{
  ly_out *out;
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uint local_4c;
  uint local_2c;
  ly_bool is_attr_local;
  lyd_node *node_local;
  jsonpr_ctx *pctx_local;
  
  if (pctx->level <= pctx->level_printed) {
    pcVar4 = "";
    if ((pctx->options & 2) == 0) {
      pcVar4 = "\n";
    }
    ly_print_(pctx->out,",%s",pcVar4);
  }
  if ((pctx->level != 1) && (iVar2 = json_nscmp(node,pctx->parent), iVar2 == 0)) {
    if ((pctx->options & 2) == 0) {
      local_4c = (uint)pctx->level << 1;
    }
    else {
      local_4c = 0;
    }
    pcVar4 = "";
    if (is_attr != '\0') {
      pcVar4 = "@";
    }
    pcVar1 = "\t";
    if ((pctx->options & 2) == 0) {
      pcVar1 = ", ";
    }
    ly_print_(pctx->out,"%*s\"%s%s\":%s",(ulong)local_4c,"",pcVar4,node->schema->name,pcVar1 + 1);
    return LY_SUCCESS;
  }
  out = pctx->out;
  if ((pctx->options & 2) == 0) {
    local_2c = (uint)pctx->level << 1;
  }
  else {
    local_2c = 0;
  }
  pcVar4 = "";
  if (is_attr != '\0') {
    pcVar4 = "@";
  }
  pcVar3 = node_prefix(node);
  pcVar1 = "\t";
  if ((pctx->options & 2) == 0) {
    pcVar1 = ", ";
  }
  ly_print_(out,"%*s\"%s%s:%s\":%s",(ulong)local_2c,"",pcVar4,pcVar3,node->schema->name,pcVar1 + 1);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
json_print_member(struct jsonpr_ctx *pctx, const struct lyd_node *node, ly_bool is_attr)
{
    PRINT_COMMA;
    if ((LEVEL == 1) || json_nscmp(node, pctx->parent)) {
        /* print "namespace" */
        ly_print_(pctx->out, "%*s\"%s%s:%s\":%s", INDENT, is_attr ? "@" : "",
                node_prefix(node), node->schema->name, DO_FORMAT ? " " : "");
    } else {
        ly_print_(pctx->out, "%*s\"%s%s\":%s", INDENT, is_attr ? "@" : "", node->schema->name, DO_FORMAT ? " " : "");
    }

    return LY_SUCCESS;
}